

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[9],char_const*,char[17],char_const*,char[43],unsigned_int,char[32],unsigned_int,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [9],char **Args_1,
          char (*Args_2) [17],char **Args_3,char (*Args_4) [43],uint *Args_5,char (*Args_6) [32],
          uint *Args_7,char (*Args_8) [3])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[9],char_const*,char[17],char_const*,char[43],unsigned_int,char[32],unsigned_int,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [9])this,(char **)Args,(char (*) [17])Args_1,(char **)Args_2,
             (char (*) [43])Args_3,(uint *)Args_4,(char (*) [32])Args_5,(uint *)Args_6,
             (char (*) [3])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}